

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O0

bool __thiscall ON_PolylineCurve::IsLinear(ON_PolylineCurve *this,double tolerance)

{
  byte bVar1;
  int iVar2;
  ON_3dPoint *pOVar3;
  ON_Curve *ptr;
  undefined1 local_60 [8];
  ON_NurbsCurve nurbs_curve;
  bool rc;
  double tolerance_local;
  ON_PolylineCurve *this_local;
  
  nurbs_curve.m_cv._7_1_ = 0;
  ON_NurbsCurve::ON_NurbsCurve((ON_NurbsCurve *)local_60);
  nurbs_curve.super_ON_Curve.super_ON_Geometry.super_ON_Object.m_userdata_list._0_4_ = this->m_dim;
  nurbs_curve.super_ON_Curve.super_ON_Geometry.super_ON_Object.m_userdata_list._4_4_ = 0;
  nurbs_curve.m_dim = 2;
  nurbs_curve.m_is_rat =
       ON_SimpleArray<ON_3dPoint>::Count((ON_SimpleArray<ON_3dPoint> *)&this->m_pline);
  if (1 < nurbs_curve.m_is_rat) {
    nurbs_curve._48_8_ =
         ON_SimpleArray<ON_3dPoint>::operator[]((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,0);
    pOVar3 = ON_SimpleArray<ON_3dPoint>::operator[]((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,1);
    nurbs_curve.m_knot._0_4_ = (undefined4)((ulong)((long)pOVar3 - nurbs_curve._48_8_) >> 3);
    nurbs_curve._32_8_ = ON_SimpleArray<double>::Array(&this->m_t);
    iVar2 = (**(_func_int **)((long)local_60 + 0x170))(tolerance);
    nurbs_curve.m_cv._7_1_ = (byte)iVar2 & 1;
    nurbs_curve.m_cv_stride = 0;
    nurbs_curve.m_cv_capacity = 0;
    nurbs_curve.m_knot_capacity_and_tags = 0;
    nurbs_curve._36_4_ = 0;
  }
  bVar1 = nurbs_curve.m_cv._7_1_;
  ON_NurbsCurve::~ON_NurbsCurve((ON_NurbsCurve *)local_60);
  return (bool)(bVar1 & 1);
}

Assistant:

bool
ON_PolylineCurve::IsLinear( // true if curve locus is a line segment
      double tolerance // tolerance to use when checking linearity
      ) const
{
  bool rc = false;
  ON_NurbsCurve nurbs_curve;
  nurbs_curve.m_dim = m_dim;
  nurbs_curve.m_is_rat = 0;
  nurbs_curve.m_order = 2;
  nurbs_curve.m_cv_count = m_pline.Count();
  if ( nurbs_curve.m_cv_count >= 2 )
  {
    nurbs_curve.m_cv = const_cast<double*>(&m_pline[0].x);
    nurbs_curve.m_cv_stride = (int)(&m_pline[1].x - nurbs_curve.m_cv); // the int converts 64 bit size_t
    nurbs_curve.m_knot = const_cast<double*>(m_t.Array());
    // using ptr to make sure we go through vtable
    const ON_Curve* ptr = &nurbs_curve;
    rc = ptr->IsLinear(tolerance);
    nurbs_curve.m_cv = 0;
    nurbs_curve.m_knot = 0;
  }
  return rc;
}